

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auto_map.cpp
# Opt level: O1

void __thiscall
CDoodadsMapper::Proceed(CDoodadsMapper *this,CLayerTiles *pLayer,int ConfigID,int Amount)

{
  CRule *pRule;
  CRuleSet *pCVar1;
  CTile *pCVar2;
  CRule *pCVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  CDoodadsMapper *this_00;
  long lVar7;
  
  if (((-1 < ConfigID) && ((pLayer->super_CLayer).m_Readonly == false)) &&
     (ConfigID < (this->m_aRuleSets).num_elements)) {
    this_00 = this;
    AnalyzeGameLayer(this);
    pCVar1 = (this->m_aRuleSets).list;
    if (pCVar1[(uint)ConfigID].m_aRules.num_elements != 0) {
      uVar4 = pLayer->m_Height * pLayer->m_Width;
      if (0 < (int)uVar4) {
        pCVar2 = pLayer->m_pTiles;
        uVar5 = 0;
        do {
          pCVar2[uVar5].m_Index = '\0';
          pCVar2[uVar5].m_Flags = '\0';
          uVar5 = uVar5 + 1;
        } while (uVar4 != uVar5);
      }
      if (0 < pCVar1[(uint)ConfigID].m_aRules.num_elements) {
        lVar7 = 0;
        lVar6 = 0;
        do {
          pCVar3 = pCVar1[(uint)ConfigID].m_aRules.list;
          pRule = (CRule *)((long)&(pCVar3->m_Rect).field_0 + lVar7);
          if ((*(int *)((long)&pCVar3->m_Location + lVar7) == 0) &&
             (0 < (this->m_FloorIDs).num_elements)) {
            PlaceDoodads(this_00,pLayer,pRule,&this->m_FloorIDs,Amount,0);
          }
          if ((pRule->m_Location == 1) && (0 < (this->m_CeilingIDs).num_elements)) {
            PlaceDoodads(this_00,pLayer,pRule,&this->m_CeilingIDs,Amount,0);
          }
          if ((pRule->m_Location == 2) && (0 < (this->m_RightWallIDs).num_elements)) {
            PlaceDoodads(this_00,pLayer,pRule,&this->m_RightWallIDs,Amount,0);
          }
          if ((pRule->m_Location == 2) && (0 < (this->m_LeftWallIDs).num_elements)) {
            PlaceDoodads(this_00,pLayer,pRule,&this->m_LeftWallIDs,Amount,1);
          }
          lVar6 = lVar6 + 1;
          lVar7 = lVar7 + 0x28;
        } while (lVar6 < pCVar1[(uint)ConfigID].m_aRules.num_elements);
      }
      (((this->super_IAutoMapper).m_pEditor)->m_Map).m_Modified = true;
    }
  }
  return;
}

Assistant:

void CDoodadsMapper::Proceed(CLayerTiles *pLayer, int ConfigID, int Amount)
{
	if(pLayer->m_Readonly || ConfigID < 0 || ConfigID >= m_aRuleSets.size())
		return;

	AnalyzeGameLayer();

	CRuleSet *pConf = &m_aRuleSets[ConfigID];

	if(!pConf->m_aRules.size())
		return;

	int MaxIndex = pLayer->m_Width*pLayer->m_Height;

	// clear tiles
	for(int i = 0 ; i < MaxIndex; i++)
	{
		pLayer->m_pTiles[i].m_Index = 0;
		pLayer->m_pTiles[i].m_Flags = 0;
	}

	// place doodads
	for(int i = 0 ; i < pConf->m_aRules.size(); i++)
	{
		CRule *pRule = &pConf->m_aRules[i];

		// floors
		if(pRule->m_Location == CRule::FLOOR && m_FloorIDs.size() > 0)
		{
			PlaceDoodads(pLayer, pRule, &m_FloorIDs, Amount);
		}

		// ceilings
		if(pRule->m_Location == CRule::CEILING && m_CeilingIDs.size() > 0)
		{
			PlaceDoodads(pLayer, pRule, &m_CeilingIDs, Amount);
		}

		// right walls
		if(pRule->m_Location == CRule::WALLS && m_RightWallIDs.size() > 0)
		{
			PlaceDoodads(pLayer, pRule, &m_RightWallIDs, Amount);
		}

		// left walls
		if(pRule->m_Location == CRule::WALLS && m_LeftWallIDs.size() > 0)
		{
			PlaceDoodads(pLayer, pRule, &m_LeftWallIDs, Amount, 1);
		}
	}

	m_pEditor->m_Map.m_Modified = true;
}